

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string_view w,uint32_t h)

{
  pointer peVar1;
  bool bVar2;
  long lVar3;
  pointer piVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  piVar4 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar4) >> 2;
  uVar6 = (ulong)h % (uVar7 & 0xffffffff);
  while( true ) {
    iVar5 = (int)uVar6;
    lVar3 = (long)piVar4[iVar5];
    if (lVar3 == -1) {
      return iVar5;
    }
    peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __x._M_str = peVar1[lVar3].word._M_dataplus._M_p;
    __x._M_len = peVar1[lVar3].word._M_string_length;
    bVar2 = std::operator!=(__x,w);
    if (!bVar2) break;
    uVar6 = (long)(iVar5 + 1) % (long)(int)uVar7 & 0xffffffff;
    piVar4 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  return iVar5;
}

Assistant:

int32_t Dictionary::find(const std::string_view w, uint32_t h) const {
  int32_t word2intsize = word2int_.size();
  int32_t id = h % word2intsize;
  while (word2int_[id] != -1 && words_[word2int_[id]].word != w) {
    id = (id + 1) % word2intsize;
  }
  return id;
}